

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>>::
emplace_back<std::basic_string_view<char,std::char_traits<char>>const&>
          (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *this,
          basic_string_view<char,_std::char_traits<char>_> *args)

{
  ulong uVar1;
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *p;
  char *pcVar2;
  size_t sVar3;
  size_t *psVar4;
  size_t *psVar5;
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *pSVar6;
  long lVar7;
  SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *__src;
  long lVar8;
  ulong uVar9;
  
  __src = (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)
          (*(long *)(this + 8) * 0x10 + *(long *)this);
  if (*(long *)(this + 8) != *(long *)(this + 0x10)) {
    pcVar2 = args->_M_str;
    *(size_t *)__src = args->_M_len;
    *(char **)(__src + 8) = pcVar2;
    lVar8 = *(long *)(this + 8);
    *(long *)(this + 8) = lVar8 + 1;
    return (reference)(*(long *)this + (lVar8 + 1) * 0x10 + -0x10);
  }
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar1 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar1 * 2) {
    uVar9 = uVar1 * 2;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar7 = (long)__src - *(long *)this;
  psVar4 = (size_t *)operator_new(uVar9 << 4);
  pcVar2 = args->_M_str;
  *(size_t *)((long)psVar4 + lVar7) = args->_M_len;
  ((size_t *)((long)psVar4 + lVar7))[1] = (size_t)pcVar2;
  p = *(SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> **)this;
  lVar8 = *(long *)(this + 8);
  pSVar6 = p;
  psVar5 = psVar4;
  if (p + (lVar8 * 0x10 - (long)__src) ==
      (SmallVectorBase<std::basic_string_view<char,std::char_traits<char>>> *)0x0) {
    if (lVar8 != 0) {
      do {
        sVar3 = *(size_t *)(pSVar6 + 8);
        *psVar5 = *(size_t *)pSVar6;
        psVar5[1] = sVar3;
        pSVar6 = pSVar6 + 0x10;
        psVar5 = psVar5 + 2;
      } while (pSVar6 != __src);
    }
  }
  else {
    for (; pSVar6 != __src; pSVar6 = pSVar6 + 0x10) {
      sVar3 = *(size_t *)(pSVar6 + 8);
      *psVar5 = *(size_t *)pSVar6;
      psVar5[1] = sVar3;
      psVar5 = psVar5 + 2;
    }
    memcpy((void *)((long)psVar4 + lVar7 + 0x10),__src,
           ((ulong)(p + (lVar8 * 0x10 - (long)__src) + -0x10) & 0xfffffffffffffff0) + 0x10);
  }
  if (p != this + 0x18) {
    operator_delete(p);
    lVar8 = *(long *)(this + 8);
  }
  *(long *)(this + 8) = lVar8 + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(size_t **)this = psVar4;
  return (reference)((long)psVar4 + lVar7);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }